

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O1

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled_Test
::TestBody(ContractTestOnClassWithInvariant_ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled_Test
           *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  string local_38;
  AssertHelper *local_18;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_38._M_dataplus._M_p = (pointer)&(this->super_ContractTestOnClassWithInvariant).sut;
      local_18 = &local_50;
      local_50.data_._0_4_ = 2;
      local_38._M_string_length = 0x13f094;
      local_38.field_2._M_allocated_capacity._0_4_ = 0x2c;
      (this->super_ContractTestOnClassWithInvariant).sut.x = 6;
      uVar1 = (this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled;
      uVar2 = (this->super_ContractTestOnClassWithInvariant).sut._contract_light_contractor;
      (this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled = uVar1 + 1;
      (this->super_ContractTestOnClassWithInvariant).sut._contract_light_contractor =
           (Contract)(uVar2 + 1);
      local_38.field_2._8_8_ = local_38._M_dataplus._M_p;
      contract_light::v_100::contract_detail::handleFailedPostCondition
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
                 ,0x2c);
      contract_light::v_100::contract_detail::InvariantPolicy::
      checkInvariant<contract_light::v_100::contract_detail::PostConditionContext<(anonymous_namespace)::TestClassWithInvariant>const>
                ((PostConditionContext<(anonymous_namespace)::TestClassWithInvariant> *)&local_38);
    }
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x8a,"Expected: sut.doubleX(2) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((TestClassWithInvariant *)local_38._M_dataplus._M_p != (TestClassWithInvariant *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((TestClassWithInvariant *)local_38._M_dataplus._M_p != (TestClassWithInvariant *)0x0)) {
        (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      }
      local_38._M_dataplus._M_p = (pointer)0x0;
    }
  }
  local_50.data_._0_1_ = (anonymous_namespace)::postConditionHasFailedFlag;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anonymous_namespace)::postConditionHasFailedFlag == '\0') {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_50,(AssertionResult *)"postConditionHasFailedFlag",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x8b,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
      local_58.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"1","sut.invariantWasCalled",(int *)&local_50,
             &(this->super_ContractTestOnClassWithInvariant).sut.invariantWasCalled);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((char *)local_38._M_string_length == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"1","sut.postConditionWasCalled",(int *)&local_50,
             &(this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((char *)local_38._M_string_length == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x8e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled)
{
  EXPECT_NO_THROW(sut.doubleX(2));
  EXPECT_TRUE(postConditionHasFailedFlag);

  EXPECT_EQ(1, sut.invariantWasCalled);
  EXPECT_EQ(1, sut.postConditionWasCalled);
}